

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::~IfcPolyLoop(IfcPolyLoop *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcLoop.field_0x40 = &PTR__IfcPolyLoop_0087e5e8;
  *(undefined ***)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x28 =
       &PTR__IfcPolyLoop_0087e688;
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcPolyLoop_0087e610;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcPolyLoop_0087e638;
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPolyLoop_0087e660;
  pvVar1 = *(void **)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
                      super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcLoop.field_0x40,0x70);
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}